

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.cpp
# Opt level: O3

int Lodtalk::Float::stSub(InterpreterProxy *interpreter)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  double dVar6;
  ulong uVar7;
  double dVar8;
  undefined8 *puVar4;
  undefined8 *puVar5;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) != 1) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  uVar2 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
  puVar4 = (undefined8 *)CONCAT44(extraout_var_00,uVar2);
  uVar3 = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
  puVar5 = (undefined8 *)CONCAT44(extraout_var_01,uVar3);
  if (((((uVar2 & 1) == 0) && ((uVar2 & 6) != 4)) &&
      (((uVar2 & 6) != 0 || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22)))) ||
     ((((uVar3 & 1) == 0 && ((uVar3 & 6) != 4)) &&
      (((uVar3 & 6) != 0 || ((uint)((ulong)*puVar5 >> 0x2a) != 0x22)))))) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
    return iVar1;
  }
  if ((uVar2 & 1) == 0) {
    if ((uVar2 & 6) == 4) {
      uVar7 = ((ulong)puVar4 >> 3) + 0x7000000000000000;
      dVar6 = (double)(uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f);
    }
    else {
      if (((uVar2 & 6) != 0) || ((uint)((ulong)*puVar4 >> 0x2a) != 0x22)) goto LAB_00140cb6;
      dVar6 = (double)puVar4[1];
    }
  }
  else {
    dVar6 = (double)((long)puVar4 >> 1);
  }
  if ((uVar3 & 1) == 0) {
    if ((uVar3 & 6) == 4) {
      uVar7 = ((ulong)puVar5 >> 3) + 0x7000000000000000;
      dVar8 = (double)(uVar7 >> 1 | (ulong)((uVar7 & 1) != 0) << 0x3f);
    }
    else {
      if (((uVar3 & 6) != 0) || ((uint)((ulong)*puVar5 >> 0x2a) != 0x22)) {
LAB_00140cb6:
        __assert_fail("isFloatOrInt()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                      ,0x21e,"double Lodtalk::Oop::decodeFloatOrInt() const");
      }
      dVar8 = (double)puVar5[1];
    }
  }
  else {
    dVar8 = (double)((long)puVar5 >> 1);
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x14])(dVar6 - dVar8,interpreter);
  return iVar1;
}

Assistant:

int Float::stSub(InterpreterProxy *interpreter)
{
    if (interpreter->getArgumentCount() != 1)
        return interpreter->primitiveFailed();

    auto a = interpreter->getReceiver();
    auto b = interpreter->getTemporary(0);
    if (!a.isFloatOrInt() || !b.isFloatOrInt())
        return interpreter->primitiveFailed();

    auto fa = a.decodeFloatOrInt();
    auto fb = b.decodeFloatOrInt();
    return interpreter->returnFloat(fa - fb);
}